

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

bool Fossilize::add_application_filters
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                *output,Value *filters)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  Pointer pVVar1;
  bool bVar2;
  uint uVar3;
  ConstMemberIterator CVar4;
  ConstMemberIterator CVar5;
  Value *this;
  Type pGVar6;
  Type pGVar7;
  Ch *pCVar8;
  mapped_type *this_00;
  uint default_value;
  uint default_value_00;
  uint default_value_01;
  char *__ptr;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar9;
  size_t sStack_120;
  allocator local_111;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_110;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_108;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_100;
  Pointer local_f8;
  EnvInfo local_f0;
  AppInfo info;
  
  local_100 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)output;
  if ((filters->data_).f.flags == 3) {
    CVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(filters);
    local_108 = filters;
    while( true ) {
      CVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(local_108);
      if (CVar4.ptr_ == CVar5.ptr_) break;
      if (((CVar4.ptr_)->value).data_.f.flags != 3) goto LAB_0013f823;
      value = &(CVar4.ptr_)->value;
      info.minimum_api_version = 0x400000;
      info.minimum_application_version = 0;
      info.minimum_engine_version = 0;
      info.record_immutable_samplers = true;
      info.variant_dependencies_feature.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      info.variant_dependencies_feature.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      info.variant_dependencies.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      info.variant_dependencies.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.env_infos.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.variant_dependencies.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      info.env_infos.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      info.env_infos.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      info.variant_dependencies_feature.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar3 = default_get_member_uint(value,"minimumApiVersion",default_value);
      info.minimum_api_version = uVar3;
      info.minimum_engine_version =
           default_get_member_uint(value,"minimumEngineVersion",default_value_00);
      uVar3 = default_get_member_uint(value,"minimumApplicationVersion",default_value_01);
      info.minimum_application_version = uVar3;
      this = maybe_get_member(value,"recordImmutableSamplers");
      bVar2 = true;
      local_f8 = CVar4.ptr_;
      if ((this != (Value *)0x0) &&
         ((undefined1  [16])((undefined1  [16])this->data_ & (undefined1  [16])0x8000000000000) !=
          (undefined1  [16])0x0)) {
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetBool(this);
      }
      local_110 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   *)value;
      info.record_immutable_samplers = bVar2;
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(value,"blacklistedEnvironments");
      if (bVar2) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(local_110,"blacklistedEnvironments");
        if ((pGVar6->data_).f.flags == 3) {
          std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::clear
                    (&info.env_infos);
          CVar4 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(pGVar6);
          pGVar9 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&(CVar4.ptr_)->value;
          while( true ) {
            CVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd(pGVar6);
            if ((Pointer)(pGVar9 + -0x10) == CVar4.ptr_) break;
            if (*(short *)(pGVar9 + 0xe) != 3) {
              __ptr = "Fossilize ERROR: blacklistEnvironment element must be object.\n";
              sStack_120 = 0x3e;
              goto LAB_0013f7f9;
            }
            local_f0.env._M_dataplus._M_p = (pointer)&local_f0.env.field_2;
            local_f0.env._M_string_length = 0;
            local_f0.env.field_2._M_local_buf[0] = '\0';
            local_f0.contains._M_dataplus._M_p = (pointer)&local_f0.contains.field_2;
            local_f0.contains._M_string_length = 0;
            local_f0.contains.field_2._M_local_buf[0] = '\0';
            local_f0.equals._M_dataplus._M_p = (pointer)&local_f0.equals.field_2;
            local_f0.equals._M_string_length = 0;
            local_f0.equals.field_2._M_local_buf[0] = '\0';
            local_f0.nonnull = false;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(pGVar9 + -0x10));
            std::__cxx11::string::assign((char *)&local_f0);
            bVar2 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pGVar9,"contains");
            if (bVar2) {
              pGVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(pGVar9,"contains");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) !=
                  (undefined1  [16])0x0) {
                pGVar7 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar9,"contains");
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetString(pGVar7);
                std::__cxx11::string::assign((char *)&local_f0.contains);
              }
            }
            bVar2 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pGVar9,"equals");
            if (bVar2) {
              pGVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(pGVar9,"equals");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) !=
                  (undefined1  [16])0x0) {
                pGVar7 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar9,"equals");
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetString(pGVar7);
                std::__cxx11::string::assign((char *)&local_f0.equals);
              }
            }
            bVar2 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)pGVar9,"nonnull");
            if (bVar2) {
              pGVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(pGVar9,"nonnull");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x8000000000000) !=
                  (undefined1  [16])0x0) {
                pGVar7 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar9,"nonnull");
                local_f0.nonnull =
                     rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetBool(pGVar7);
              }
            }
            std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::
            emplace_back<Fossilize::EnvInfo>(&info.env_infos,&local_f0);
            EnvInfo::~EnvInfo(&local_f0);
            pGVar9 = pGVar9 + 0x20;
          }
          goto LAB_0013f712;
        }
        __ptr = "Fossilize ERROR: blacklistedEnvironments must be an object.\n";
        sStack_120 = 0x3c;
LAB_0013f7f9:
        fwrite(__ptr,sStack_120,1,_stderr);
LAB_0013f802:
        AppInfo::~AppInfo(&info);
        goto LAB_0013f80f;
      }
LAB_0013f712:
      pGVar9 = local_110;
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_110,"bucketVariantDependencies");
      if (bVar2) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(pGVar9,"bucketVariantDependencies");
        bVar2 = parse_bucket_variant_dependencies(pGVar6,&info.variant_dependencies);
        if (!bVar2) goto LAB_0013f802;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)pGVar9,"bucketVariantFeatureDependencies");
      if (bVar2) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(pGVar9,"bucketVariantFeatureDependencies");
        bVar2 = parse_bucket_variant_dependencies(pGVar6,&info.variant_dependencies_feature);
        if (!bVar2) goto LAB_0013f802;
      }
      pVVar1 = local_f8;
      pCVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&local_f8->name);
      std::__cxx11::string::string((string *)&local_f0,pCVar8,&local_111);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_100,&local_f0.env);
      AppInfo::operator=(this_00,&info);
      std::__cxx11::string::_M_dispose();
      AppInfo::~AppInfo(&info);
      CVar4.ptr_ = pVVar1 + 1;
    }
    bVar2 = true;
  }
  else {
LAB_0013f823:
    fwrite("Fossilize ERROR: Not an object.\n",0x20,1,_stderr);
LAB_0013f80f:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool add_application_filters(std::unordered_map<std::string, AppInfo> &output, const Value *filters)
{
	if (!filters->IsObject())
	{
		LOGE("Not an object.\n");
		return false;
	}

	for (auto itr = filters->MemberBegin(); itr != filters->MemberEnd(); ++itr)
	{
		if (!itr->value.IsObject())
		{
			LOGE("Not an object.\n");
			return false;
		}

		AppInfo info;

		auto &value = itr->value;
		info.minimum_api_version = default_get_member_uint(value, "minimumApiVersion");
		info.minimum_engine_version = default_get_member_uint(value, "minimumEngineVersion");
		info.minimum_application_version = default_get_member_uint(value, "minimumApplicationVersion");
		info.record_immutable_samplers = default_get_member_bool(value, "recordImmutableSamplers", true);
		if (value.HasMember("blacklistedEnvironments"))
			if (!parse_blacklist_environments(value["blacklistedEnvironments"], info.env_infos))
				return false;
		if (value.HasMember("bucketVariantDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantDependencies"], info.variant_dependencies))
				return false;
		if (value.HasMember("bucketVariantFeatureDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantFeatureDependencies"], info.variant_dependencies_feature))
				return false;
		output[itr->name.GetString()] = std::move(info);
	}

	return true;
}